

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_tcp_conn.c
# Opt level: O0

void uo_tcp_conn_advance(uo_cb *cb)

{
  char cVar1;
  void *pvVar2;
  bool bVar3;
  char current_state;
  uo_tcp_conn *tcp_conn;
  uo_cb *cb_local;
  
  pvVar2 = uo_cb_stack_index(cb,0);
  LOCK();
  cVar1 = *(char *)((long)pvVar2 + 100);
  *(char *)((long)pvVar2 + 100) = '\0';
  UNLOCK();
  if (cVar1 == '\0') {
    LOCK();
    bVar3 = *(char *)((long)pvVar2 + 100) == '\0';
    if (bVar3) {
      *(char *)((long)pvVar2 + 100) = 'i';
    }
    UNLOCK();
    if (!bVar3) {
      uo_cb_append_func(cb,uo_tcp_conn_advance);
    }
  }
  else if (cVar1 == 'c') {
    uo_cb_append_cb(cb,*(uo_cb **)(*(long *)((long)pvVar2 + 0x38) + 0x28));
    uo_cb_append_func(cb,uo_tcp_conn_close);
  }
  else if (cVar1 == 'r') {
    uo_cb_append_cb(cb,*(uo_cb **)(*(long *)((long)pvVar2 + 0x38) + 8));
    uo_cb_append_func(cb,uo_tcp_conn_before_recv);
  }
  else if (cVar1 == 's') {
    uo_cb_append_cb(cb,*(uo_cb **)(*(long *)((long)pvVar2 + 0x38) + 0x18));
    uo_cb_append_func(cb,uo_tcp_conn_send);
  }
  uo_cb_invoke(cb);
  return;
}

Assistant:

static void uo_tcp_conn_advance(
    uo_cb *cb)
{
    uo_tcp_conn *tcp_conn = uo_cb_stack_index(cb, 0);

    switch (atomic_exchange(&tcp_conn->state, '\0'))
    {
        case 'r':
            uo_cb_append(cb, tcp_conn->evt_handlers->before_recv);
            uo_cb_append(cb, uo_tcp_conn_before_recv);
            break;

        case 's':
            uo_cb_append(cb, tcp_conn->evt_handlers->before_send);
            uo_cb_append(cb, uo_tcp_conn_send);
            break;

        case 'c':
            uo_cb_append(cb, tcp_conn->evt_handlers->before_close);
            uo_cb_append(cb, uo_tcp_conn_close);
            break;

        case '\0':
        {
            char current_state = '\0';
            if (!atomic_compare_exchange_strong(&tcp_conn->state, &current_state, 'i'))
                uo_cb_append(cb, uo_tcp_conn_advance);
        }
    }

    uo_cb_invoke(cb);
}